

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O2

ProStringList * __thiscall
ProjectBuilderMakefileGenerator::fixListForOutput
          (ProStringList *__return_storage_ptr__,ProjectBuilderMakefileGenerator *this,char *where)

{
  QMakeProject *this_00;
  ProStringList *l;
  long in_FS_OFFSET;
  ProKey PStack_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&PStack_58,where);
  l = QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,&PStack_58);
  fixListForOutput(__return_storage_ptr__,this,l);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&PStack_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProStringList
ProjectBuilderMakefileGenerator::fixListForOutput(const char *where)
{
    return fixListForOutput(project->values(where));
}